

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O0

SQTable * __thiscall SQTable::Clone(SQTable *this)

{
  SQInteger SVar1;
  SQObjectPtr val;
  SQObjectPtr key;
  SQInteger ridx;
  SQTable *nt;
  SQInteger in_stack_ffffffffffffff88;
  SQSharedState *in_stack_ffffffffffffff90;
  SQTable *this_00;
  SQObjectPtr *in_stack_ffffffffffffffa8;
  SQObjectValue in_stack_ffffffffffffffb0;
  SQObjectPtr *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  SQTable *in_stack_ffffffffffffffc8;
  SQObjectPtr local_28;
  SQInteger local_18;
  SQTable *local_10;
  
  local_10 = Create(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_18 = 0;
  ::SQObjectPtr::SQObjectPtr(&local_28);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffc8);
  while( true ) {
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffa8,local_18);
    SVar1 = Next(in_stack_ffffffffffffffc8,(bool)in_stack_ffffffffffffffc7,in_stack_ffffffffffffffb8
                 ,in_stack_ffffffffffffffb0.nInteger,in_stack_ffffffffffffffa8);
    local_18 = SVar1;
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff90);
    if (SVar1 == -1) break;
    NewSlot(in_stack_ffffffffffffffc8,
            (SQObjectPtr *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
            in_stack_ffffffffffffffb8);
  }
  SQDelegable::SetDelegate((SQDelegable *)0xffffffffffffffff,(SQTable *)in_stack_ffffffffffffff90);
  this_00 = local_10;
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_10);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
  return this_00;
}

Assistant:

SQTable *SQTable::Clone()
{
    SQTable *nt=Create(_opt_ss(this),_numofnodes);
#ifdef _FAST_CLONE
    _HashNode *basesrc = _nodes;
    _HashNode *basedst = nt->_nodes;
    _HashNode *src = _nodes;
    _HashNode *dst = nt->_nodes;
    SQInteger n = 0;
    for(n = 0; n < _numofnodes; n++) {
        dst->key = src->key;
        dst->val = src->val;
        if(src->next) {
            assert(src->next > basesrc);
            dst->next = basedst + (src->next - basesrc);
            assert(dst != dst->next);
        }
        dst++;
        src++;
    }
    assert(_firstfree > basesrc);
    assert(_firstfree != NULL);
    nt->_firstfree = basedst + (_firstfree - basesrc);
    nt->_usednodes = _usednodes;
#else
    SQInteger ridx=0;
    SQObjectPtr key,val;
    while((ridx=Next(true,ridx,key,val))!=-1){
        nt->NewSlot(key,val);
    }
#endif
    nt->SetDelegate(_delegate);
    return nt;
}